

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *jp2,OPJ_BYTE *p_cdef_header_data,OPJ_UINT32 p_cdef_header_size
                          ,opj_event_mgr_t *p_manager)

{
  void *pvVar1;
  uint local_40;
  ushort local_3a;
  OPJ_UINT32 l_value;
  OPJ_UINT16 i;
  opj_jp2_cdef_info_t *cdef_info;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_cdef_header_size_local;
  OPJ_BYTE *p_cdef_header_data_local;
  opj_jp2_t *jp2_local;
  
  cdef_info = (opj_jp2_cdef_info_t *)p_manager;
  p_manager_local._4_4_ = p_cdef_header_size;
  pOStack_20 = p_cdef_header_data;
  p_cdef_header_data_local = (OPJ_BYTE *)jp2;
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x57b,
                  "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_cdef_header_data != (OPJ_BYTE *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      if ((jp2->color).jp2_cdef == (opj_jp2_cdef_t *)0x0) {
        if (p_cdef_header_size < 2) {
          opj_event_msg(p_manager,1,"Insufficient data for CDEF box.\n");
          jp2_local._4_4_ = 0;
        }
        else {
          opj_read_bytes_LE(p_cdef_header_data,&local_40,2);
          pOStack_20 = pOStack_20 + 2;
          if ((local_40 & 0xffff) == 0) {
            opj_event_msg((opj_event_mgr_t *)cdef_info,1,
                          "Number of channel description is equal to zero in CDEF box.\n");
            jp2_local._4_4_ = 0;
          }
          else if (p_manager_local._4_4_ < (local_40 & 0xffff) * 6 + 2) {
            opj_event_msg((opj_event_mgr_t *)cdef_info,1,"Insufficient data for CDEF box.\n");
            jp2_local._4_4_ = 0;
          }
          else {
            _l_value = opj_malloc((ulong)local_40 * 6);
            if (_l_value == (void *)0x0) {
              jp2_local._4_4_ = 0;
            }
            else {
              pvVar1 = opj_malloc(0x10);
              *(void **)(p_cdef_header_data_local + 0x90) = pvVar1;
              if (*(long *)(p_cdef_header_data_local + 0x90) == 0) {
                opj_free(_l_value);
                jp2_local._4_4_ = 0;
              }
              else {
                **(undefined8 **)(p_cdef_header_data_local + 0x90) = _l_value;
                *(short *)(*(long *)(p_cdef_header_data_local + 0x90) + 8) = (short)local_40;
                for (local_3a = 0;
                    local_3a < *(ushort *)(*(long *)(p_cdef_header_data_local + 0x90) + 8);
                    local_3a = local_3a + 1) {
                  opj_read_bytes_LE(pOStack_20,&local_40,2);
                  pOStack_20 = pOStack_20 + 2;
                  *(short *)((long)_l_value + (ulong)local_3a * 6) = (short)local_40;
                  opj_read_bytes_LE(pOStack_20,&local_40,2);
                  pOStack_20 = pOStack_20 + 2;
                  *(short *)((long)_l_value + (ulong)local_3a * 6 + 2) = (short)local_40;
                  opj_read_bytes_LE(pOStack_20,&local_40,2);
                  pOStack_20 = pOStack_20 + 2;
                  *(short *)((long)_l_value + (ulong)local_3a * 6 + 4) = (short)local_40;
                }
                jp2_local._4_4_ = 1;
              }
            }
          }
        }
      }
      else {
        jp2_local._4_4_ = 0;
      }
      return jp2_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x57d,
                  "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_cdef_header_data != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x57c,
                "OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_cdef(opj_jp2_t * jp2,
                                  OPJ_BYTE * p_cdef_header_data,
                                  OPJ_UINT32 p_cdef_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_cdef_info_t *cdef_info;
    OPJ_UINT16 i;
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_cdef_header_data != 00);
    assert(p_manager != 00);
    (void)p_cdef_header_size;

    /* Part 1, I.5.3.6: 'The shall be at most one Channel Definition box
     * inside a JP2 Header box.'*/
    if (jp2->color.jp2_cdef) {
        return OPJ_FALSE;
    }

    if (p_cdef_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CDEF box.\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_cdef_header_data, &l_value, 2);        /* N */
    p_cdef_header_data += 2;

    if ((OPJ_UINT16)l_value == 0) { /* szukw000: FIXME */
        opj_event_msg(p_manager, EVT_ERROR,
                      "Number of channel description is equal to zero in CDEF box.\n");
        return OPJ_FALSE;
    }

    if (p_cdef_header_size < 2 + (OPJ_UINT32)(OPJ_UINT16)l_value * 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CDEF box.\n");
        return OPJ_FALSE;
    }

    cdef_info = (opj_jp2_cdef_info_t*) opj_malloc(l_value * sizeof(
                    opj_jp2_cdef_info_t));
    if (!cdef_info) {
        return OPJ_FALSE;
    }

    jp2->color.jp2_cdef = (opj_jp2_cdef_t*)opj_malloc(sizeof(opj_jp2_cdef_t));
    if (!jp2->color.jp2_cdef) {
        opj_free(cdef_info);
        return OPJ_FALSE;
    }
    jp2->color.jp2_cdef->info = cdef_info;
    jp2->color.jp2_cdef->n = (OPJ_UINT16) l_value;

    for (i = 0; i < jp2->color.jp2_cdef->n; ++i) {
        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Cn^i */
        p_cdef_header_data += 2;
        cdef_info[i].cn = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Typ^i */
        p_cdef_header_data += 2;
        cdef_info[i].typ = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cdef_header_data, &l_value, 2);            /* Asoc^i */
        p_cdef_header_data += 2;
        cdef_info[i].asoc = (OPJ_UINT16) l_value;
    }

    return OPJ_TRUE;
}